

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  TestPartResultReporterInterface *in_RDI;
  int i;
  value_type *in_stack_ffffffffffffff88;
  UnitTestImpl *in_stack_ffffffffffffff90;
  undefined1 local_58 [16];
  char **in_stack_ffffffffffffffb8;
  undefined4 local_34;
  TestPartResultReporterInterface *local_8;
  
  g_init_gtest_count = g_init_gtest_count + 1;
  if ((g_init_gtest_count == 1) && (0 < *(int *)&in_RDI->_vptr_TestPartResultReporterInterface)) {
    local_8 = in_RDI;
    StreamableToString<char*>(in_stack_ffffffffffffffb8);
    std::__cxx11::string::operator=
              ((string *)g_executable_path_abi_cxx11_,(string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x152ba0);
    for (local_34 = 0; local_34 != *(int *)&local_8->_vptr_TestPartResultReporterInterface;
        local_34 = local_34 + 1) {
      in_stack_ffffffffffffff90 = (UnitTestImpl *)local_58;
      StreamableToString<char*>(in_stack_ffffffffffffffb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string((string *)local_58);
    }
    ParseGoogleTestFlagsOnly((int *)in_stack_ffffffffffffff90,(char **)in_stack_ffffffffffffff88);
    GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  g_init_gtest_count++;

  // We don't want to run the initialization code twice.
  if (g_init_gtest_count != 1) return;

  if (*argc <= 0) return;

  internal::g_executable_path = internal::StreamableToString(argv[0]);

#if GTEST_HAS_DEATH_TEST

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#endif  // GTEST_HAS_DEATH_TEST

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}